

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O1

void Fl::remove_timeout(Fl_Timeout_Handler cb,void *argp)

{
  Timeout *pTVar1;
  Timeout **ppTVar2;
  
  if (first_timeout != (Timeout *)0x0) {
    ppTVar2 = &first_timeout;
    pTVar1 = first_timeout;
    do {
      if ((pTVar1->cb == cb) && ((argp == (void *)0x0 || (pTVar1->arg == argp)))) {
        *ppTVar2 = pTVar1->next;
        pTVar1->next = free_timeout;
        free_timeout = pTVar1;
      }
      else {
        ppTVar2 = &pTVar1->next;
      }
      pTVar1 = *ppTVar2;
    } while (pTVar1 != (Timeout *)0x0);
  }
  return;
}

Assistant:

void Fl::remove_timeout(Fl_Timeout_Handler cb, void *argp) {
  for (Timeout** p = &first_timeout; *p;) {
    Timeout* t = *p;
    if (t->cb == cb && (t->arg == argp || !argp)) {
      *p = t->next;
      t->next = free_timeout;
      free_timeout = t;
    } else {
      p = &(t->next);
    }
  }
}